

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall pbrt::syntactic::ParamArray<float>::add(ParamArray<float> *this,string *text)

{
  int iVar1;
  iterator __position;
  char *__nptr;
  int *piVar2;
  undefined8 uVar3;
  allocator local_55;
  float local_54;
  char *local_50;
  char *local_48 [2];
  char local_38 [16];
  
  std::__cxx11::string::string((string *)local_48,(text->_M_dataplus)._M_p,&local_55);
  __nptr = local_48[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  local_54 = strtof(__nptr,&local_50);
  if (local_50 == __nptr) {
    uVar3 = std::__throw_invalid_argument("stof");
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    _Unwind_Resume(uVar3);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_00125af6;
    local_54 = (float)std::__throw_out_of_range("stof");
  }
  *piVar2 = iVar1;
LAB_00125af6:
  __position._M_current =
       (this->super_vector<float,_std::allocator<float>_>).
       super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_vector<float,_std::allocator<float>_>).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&this->super_vector<float,_std::allocator<float>_>,__position,&local_54);
  }
  else {
    *__position._M_current = local_54;
    (this->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         __position._M_current + 1;
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void ParamArray<float>::add(const std::string &text)
    { this->push_back(std::stof(text.c_str())); }